

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# opennurbs_string.cpp
# Opt level: O3

char * __thiscall ON_String::SetLength(ON_String *this,size_t string_length)

{
  char *pcVar1;
  ON_Internal_Empty_aString *pOVar2;
  uint uVar3;
  
  pOVar2 = (ON_Internal_Empty_aString *)(this->m_s + -0xc);
  if (this->m_s == (char *)0x0) {
    pOVar2 = &empty_astring;
  }
  uVar3 = (uint)string_length;
  if ((pOVar2->header).string_capacity <= (int)uVar3) {
    ReserveArray(this,(long)(int)uVar3);
  }
  if (-1 < (int)uVar3) {
    pOVar2 = (ON_Internal_Empty_aString *)(this->m_s + -0xc);
    if (this->m_s == (char *)0x0) {
      pOVar2 = &empty_astring;
    }
    if ((int)uVar3 <= (pOVar2->header).string_capacity) {
      CopyArray(this);
      pcVar1 = this->m_s;
      pOVar2 = (ON_Internal_Empty_aString *)(pcVar1 + -0xc);
      if (pcVar1 == (char *)0x0) {
        pOVar2 = &empty_astring;
      }
      (pOVar2->header).string_length = uVar3;
      pcVar1[uVar3 & 0x7fffffff] = '\0';
      return this->m_s;
    }
  }
  return (char *)0x0;
}

Assistant:

char* ON_String::SetLength(size_t string_length)
{
  int length = (int)string_length; // for 64 bit compilers
  if ( length >= Header()->string_capacity ) {
    ReserveArray(length);
  }
  if ( length >= 0 && length <= Header()->string_capacity ) {
    CopyArray();
    Header()->string_length = length;
    m_s[length] = 0;
    return m_s;
  }
  return nullptr;
}